

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

int32_t ggml_get_i32_1d(ggml_tensor *tensor,int i)

{
  ulong uVar1;
  int in_ESI;
  undefined4 *in_RDI;
  float fVar2;
  int64_t id [4];
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  ggml_tensor *in_stack_ffffffffffffffd8;
  undefined1 local_20 [12];
  int local_14;
  undefined4 *local_10;
  int32_t local_4;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  uVar1 = ggml_is_contiguous(in_RDI);
  if ((uVar1 & 1) == 0) {
    memset(&stack0xffffffffffffffc8,0,0x20);
    ggml_unravel_index(local_10,(long)local_14,&stack0xffffffffffffffc8,&stack0xffffffffffffffd0,
                       &stack0xffffffffffffffd8,local_20);
    local_4 = ggml_get_i32_nd(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                              in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                              in_stack_ffffffffffffffc8);
  }
  else {
    switch(*local_10) {
    case 0:
      if (*(long *)(local_10 + 0xc) != 4) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x3a4,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(float)");
      }
      local_4 = (int32_t)*(float *)(*(long *)(local_10 + 0x3e) + (long)local_14 * 4);
      break;
    case 1:
      if (*(long *)(local_10 + 0xc) != 2) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x39a,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(ggml_fp16_t)");
      }
      fVar2 = ggml_lookup_fp16_to_fp32
                        (*(ggml_fp16_t *)(*(long *)(local_10 + 0x3e) + (long)local_14 * 2));
      local_4 = (int32_t)fVar2;
      break;
    default:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0x3a9,"fatal error");
    case 0x18:
      if (*(long *)(local_10 + 0xc) != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x38b,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(int8_t)");
      }
      local_4 = (int32_t)*(char *)(*(long *)(local_10 + 0x3e) + (long)local_14);
      break;
    case 0x19:
      if (*(long *)(local_10 + 0xc) != 2) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x390,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(int16_t)");
      }
      local_4 = (int32_t)*(short *)(*(long *)(local_10 + 0x3e) + (long)local_14 * 2);
      break;
    case 0x1a:
      if (*(long *)(local_10 + 0xc) != 4) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x395,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(int32_t)");
      }
      local_4 = *(int32_t *)(*(long *)(local_10 + 0x3e) + (long)local_14 * 4);
      break;
    case 0x1e:
      if (*(long *)(local_10 + 0xc) != 2) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x39f,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(ggml_bf16_t)");
      }
      fVar2 = ggml_compute_bf16_to_fp32
                        ((ggml_bf16_t)*(uint16_t *)(*(long *)(local_10 + 0x3e) + (long)local_14 * 2)
                        );
      local_4 = (int32_t)fVar2;
    }
  }
  return local_4;
}

Assistant:

int32_t ggml_get_i32_1d(const struct ggml_tensor * tensor, int i) {
    if (!ggml_is_contiguous(tensor)) {
        int64_t id[4] = { 0, 0, 0, 0 };
        ggml_unravel_index(tensor, i, &id[0], &id[1], &id[2], &id[3]);
        return ggml_get_i32_nd(tensor, id[0], id[1], id[2], id[3]);
    }
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                return ((int8_t *)(tensor->data))[i];
            }
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                return ((int16_t *)(tensor->data))[i];
            }
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                return ((int32_t *)(tensor->data))[i];
            }
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                return GGML_FP16_TO_FP32(((ggml_fp16_t *)(tensor->data))[i]);
            }
        case GGML_TYPE_BF16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_bf16_t));
                return GGML_BF16_TO_FP32(((ggml_bf16_t *)(tensor->data))[i]);
            }
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                return ((float *)(tensor->data))[i];
            }
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}